

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

bool __thiscall
cmCMakePresetsGraphInternal::EqualsCondition::Evaluate
          (EqualsCondition *this,MacroExpanderVector *expanders,int version,optional<bool> *out)

{
  pointer pcVar1;
  ExpandMacroResult EVar2;
  int iVar3;
  _Optional_payload_base<bool> _Var4;
  bool bVar5;
  string rhs;
  string lhs;
  string local_70;
  string local_50;
  
  pcVar1 = (this->Lhs)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->Lhs)._M_string_length);
  EVar2 = ExpandMacros(&local_50,expanders,version);
  if (EVar2 == Ignore) {
    bVar5 = true;
    if ((out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged == true) {
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
      _M_engaged = false;
    }
  }
  else if (EVar2 == Error) {
    bVar5 = false;
  }
  else {
    pcVar1 = (this->Rhs)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (this->Rhs)._M_string_length);
    EVar2 = ExpandMacros(&local_70,expanders,version);
    if (EVar2 == Ignore) {
      bVar5 = true;
      if ((out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged == true) {
        (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged = false;
      }
    }
    else if (EVar2 == Error) {
      bVar5 = false;
    }
    else {
      _Var4._M_payload = (_Storage<bool,_true>)0x0;
      _Var4._M_engaged = true;
      if (local_50._M_string_length == local_70._M_string_length) {
        if (local_50._M_string_length == 0) {
          _Var4._M_payload = (_Storage<bool,_true>)0x1;
          _Var4._M_engaged = true;
        }
        else {
          iVar3 = bcmp(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,local_50._M_string_length
                      );
          _Var4 = (_Optional_payload_base<bool>)((iVar3 == 0) + 0x100);
        }
      }
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
           _Var4;
      bVar5 = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool cmCMakePresetsGraphInternal::EqualsCondition::Evaluate(
  MacroExpanderVector const& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string lhs = this->Lhs;
  CHECK_EXPAND(out, lhs, expanders, version);

  std::string rhs = this->Rhs;
  CHECK_EXPAND(out, rhs, expanders, version);

  out = (lhs == rhs);
  return true;
}